

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_impl::load_state
          (session_impl *this,bdecode_node *e,save_state_flags_t flags)

{
  pointer psVar1;
  element_type *peVar2;
  bool bVar3;
  bool bVar4;
  type_t tVar5;
  shared_ptr<libtorrent::plugin> *ext;
  pointer psVar6;
  string_view key;
  string_view key_00;
  string_view key_01;
  vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_> pack;
  bdecode_node settings;
  
  settings._32_12_ = SUB1612((undefined1  [16])0x0,4);
  settings._16_12_ = SUB1612((undefined1  [16])0x0,0);
  settings.m_root_tokens._4_4_ = 0;
  settings.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  settings.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  settings.m_token_idx = -1;
  settings.m_last_index = -1;
  settings.m_last_token = -1;
  settings.m_size = -1;
  tVar5 = bdecode_node::type(e);
  if (tVar5 != dict_t) goto LAB_0028ae98;
  if ((flags.m_val & 4) == 0) {
LAB_0028ad58:
    bVar3 = false;
  }
  else {
    key._M_str = "dht state";
    key._M_len = 9;
    bdecode_node::dict_find_dict((bdecode_node *)&pack,e,key);
    bdecode_node::operator=(&settings,(bdecode_node *)&pack);
    ::std::
    _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
    ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   *)&pack);
    bVar3 = bdecode_node::operator_cast_to_bool(&settings);
    if (!bVar3) goto LAB_0028ad58;
    libtorrent::dht::read_dht_state((dht_state *)&pack,&settings);
    libtorrent::dht::dht_state::operator=(&this->m_dht_state,(dht_state *)&pack);
    libtorrent::dht::dht_state::~dht_state((dht_state *)&pack);
    bVar3 = true;
  }
  if ((flags.m_val & 3) != 0) {
    key_00._M_str = "settings";
    key_00._M_len = 8;
    bdecode_node::dict_find_dict((bdecode_node *)&pack,e,key_00);
    bdecode_node::operator=(&settings,(bdecode_node *)&pack);
    ::std::
    _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
    ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   *)&pack);
    bVar4 = bdecode_node::operator_cast_to_bool(&settings);
    if (bVar4) {
      load_pack_from_dict((settings_pack *)&pack,&settings);
      settings_pack::clear((settings_pack *)&pack,0);
      settings_pack::clear((settings_pack *)&pack,10);
      apply_settings_pack_impl(this,&pack);
      settings_pack::~settings_pack((settings_pack *)&pack);
      bVar3 = false;
    }
  }
  if ((flags.m_val & 2) != 0) {
    key_01._M_str = "dht";
    key_01._M_len = 3;
    bdecode_node::dict_find_dict((bdecode_node *)&pack,e,key_01);
    bdecode_node::operator=(&settings,(bdecode_node *)&pack);
    ::std::
    _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
    ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   *)&pack);
    bVar4 = bdecode_node::operator_cast_to_bool(&settings);
    if (bVar4) {
      pack.
      super__Vector_base<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_set_str_004ce1b0;
      pack.
      super__Vector_base<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pack.
      super__Vector_base<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      apply_deprecated_dht_settings(&pack,&settings);
      apply_settings_pack_impl(this,&pack);
      settings_pack::~settings_pack((settings_pack *)&pack);
    }
  }
  if (bVar3) {
    start_dht(this);
  }
  psVar1 = (this->m_ses_extensions)._M_elems[0].
           super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar6 = (this->m_ses_extensions)._M_elems[0].
                super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar1; psVar6 = psVar6 + 1) {
    peVar2 = (psVar6->super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*peVar2->_vptr_plugin[0xc])(peVar2,e);
  }
LAB_0028ae98:
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&settings);
  return;
}

Assistant:

void session_impl::load_state(bdecode_node const* e
		, save_state_flags_t const flags)
	{
		TORRENT_ASSERT(is_single_thread());

		bdecode_node settings;
		if (e->type() != bdecode_node::dict_t) return;

#ifndef TORRENT_DISABLE_DHT
		bool need_update_dht = false;
		if (flags & session_handle::save_dht_state)
		{
			settings = e->dict_find_dict("dht state");
			if (settings)
			{
				m_dht_state = dht::read_dht_state(settings);
				need_update_dht = true;
			}
		}
#endif

#if TORRENT_ABI_VERSION == 1
		bool need_update_proxy = false;
		if (flags & session_handle::save_proxy)
		{
			settings = e->dict_find_dict("proxy");
			if (settings)
			{
				m_settings.bulk_set([&settings](session_settings_single_thread& s)
				{
					bdecode_node val;
					val = settings.dict_find_int("port");
					if (val) s.set_int(settings_pack::proxy_port, int(val.int_value()));
					val = settings.dict_find_int("type");
					if (val) s.set_int(settings_pack::proxy_type, int(val.int_value()));
					val = settings.dict_find_int("proxy_hostnames");
					if (val) s.set_bool(settings_pack::proxy_hostnames, val.int_value() != 0);
					val = settings.dict_find_int("proxy_peer_connections");
					if (val) s.set_bool(settings_pack::proxy_peer_connections, val.int_value() != 0);
					val = settings.dict_find_string("hostname");
					if (val) s.set_str(settings_pack::proxy_hostname, std::string(val.string_value()));
					val = settings.dict_find_string("password");
					if (val) s.set_str(settings_pack::proxy_password, std::string(val.string_value()));
					val = settings.dict_find_string("username");
					if (val) s.set_str(settings_pack::proxy_username, std::string(val.string_value()));
				});
				need_update_proxy = true;
			}
		}

		settings = e->dict_find_dict("encryption");
		if (settings)
		{
			m_settings.bulk_set([&settings](session_settings_single_thread& s)
			{
				bdecode_node val;
				val = settings.dict_find_int("prefer_rc4");
				if (val) s.set_bool(settings_pack::prefer_rc4, val.int_value() != 0);
				val = settings.dict_find_int("out_enc_policy");
				if (val) s.set_int(settings_pack::out_enc_policy, int(val.int_value()));
				val = settings.dict_find_int("in_enc_policy");
				if (val) s.set_int(settings_pack::in_enc_policy, int(val.int_value()));
				val = settings.dict_find_int("allowed_enc_level");
				if (val) s.set_int(settings_pack::allowed_enc_level, int(val.int_value()));
			});
		}
#endif

		if ((flags & session_handle::save_settings)
			|| (flags & session_handle::save_dht_settings)
			)
		{
			settings = e->dict_find_dict("settings");
			if (settings)
			{
				// apply_settings_pack will update dht and proxy
				settings_pack pack = load_pack_from_dict(settings);

				// these settings are not loaded from state
				// they are set by the client software, not configured by users
				pack.clear(settings_pack::user_agent);
				pack.clear(settings_pack::peer_fingerprint);

				apply_settings_pack_impl(pack);
#ifndef TORRENT_DISABLE_DHT
				need_update_dht = false;
#endif
#if TORRENT_ABI_VERSION == 1
				need_update_proxy = false;
#endif
			}
		}

		if (flags & session_handle::save_dht_settings)
		{
			// This is here for backwards compatibility, to support loading state
			// files in the previous file format, where the DHT settings were in
			// its own dictionary
			settings = e->dict_find_dict("dht");
			if (settings)
			{
				settings_pack sett;
				aux::apply_deprecated_dht_settings(sett, settings);
				apply_settings_pack_impl(sett);
			}
		}

#ifndef TORRENT_DISABLE_DHT
		if (need_update_dht) start_dht();
#endif
#if TORRENT_ABI_VERSION == 1
		if (need_update_proxy) update_proxy();
#endif

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto& ext : m_ses_extensions[plugins_all_idx])
		{
			ext->load_state(*e);
		}
#endif
	}